

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureBorderColorCase::test
          (TextureBorderColorCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  QueryType QVar2;
  TestLog *pTVar3;
  GLenum GVar4;
  long *plVar5;
  size_type *psVar6;
  ulong uVar7;
  undefined8 uVar8;
  ScopedLogSection section;
  ScopedLogSection section_1;
  ScopedLogSection section_3;
  IVec4 color;
  IVec4 icolor;
  string local_108;
  string local_e8;
  ScopedLogSection local_c8;
  long local_c0;
  TestLog local_b8;
  long lStack_b0;
  string local_a8;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  ScopedLogSection local_68;
  GLenum local_60;
  ScopedLogSection local_58;
  Vec4 local_50;
  IVec4 local_40;
  
  if ((this->super_TextureTest).m_type - QUERY_TEXTURE_PARAM_INTEGER_VEC4 < 2) {
    pTVar3 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Initial","");
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Initial","");
    tcu::ScopedLogSection::ScopedLogSection(&local_c8,pTVar3,&local_108,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    StateQueryUtil::verifyStateTextureParamFloatVec4
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               (Vec4 *)&local_108,(this->super_TextureTest).m_type);
    tcu::TestLog::endSection(local_c8.m_log);
  }
  QVar2 = (this->super_TextureTest).m_type;
  if (QVar2 != QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER_VEC4) {
    if (QVar2 != QUERY_TEXTURE_PARAM_PURE_INTEGER_VEC4) {
      pTVar3 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
      paVar1 = &local_108.field_2;
      local_108._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Set","");
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Set","");
      tcu::ScopedLogSection::ScopedLogSection(&local_58,pTVar3,&local_108,&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != paVar1) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      local_50.m_data[0] = 0.25;
      local_50.m_data[1] = 1.0;
      local_50.m_data[2] = 0.0;
      local_50.m_data[3] = 0.77;
      local_40.m_data[0] = 0x8000000;
      local_40.m_data[1] = 0x7fffffff;
      local_40.m_data[2] = 0;
      local_40.m_data[3] = 0xfffffff;
      glu::CallLogWrapper::glTexParameterfv
                (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 local_50.m_data);
      GVar4 = glu::CallLogWrapper::glGetError(gl);
      if (GVar4 != 0) {
        local_88 = local_78;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Got Error ","");
        local_68.m_log = (TestLog *)glu::getErrorName;
        local_60 = GVar4;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_a8,&local_68);
        uVar7 = 0xf;
        if (local_88 != local_78) {
          uVar7 = local_78[0];
        }
        if (uVar7 < local_a8._M_string_length + local_80) {
          uVar8 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            uVar8 = local_a8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar8 < local_a8._M_string_length + local_80) goto LAB_007f0aa1;
          plVar5 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_a8,0,(char *)0x0,(ulong)local_88);
        }
        else {
LAB_007f0aa1:
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_88,(ulong)local_a8._M_dataplus._M_p);
        }
        local_c8.m_log = &local_b8;
        pTVar3 = (TestLog *)(plVar5 + 2);
        if ((TestLog *)*plVar5 == pTVar3) {
          local_b8.m_log = pTVar3->m_log;
          lStack_b0 = plVar5[3];
        }
        else {
          local_b8.m_log = pTVar3->m_log;
          local_c8.m_log = (TestLog *)*plVar5;
        }
        local_c0 = plVar5[1];
        *plVar5 = (long)pTVar3;
        plVar5[1] = 0;
        *(undefined1 *)&pTVar3->m_log = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        psVar6 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_e8.field_2._M_allocated_capacity = *psVar6;
          local_e8.field_2._8_8_ = plVar5[3];
        }
        else {
          local_e8.field_2._M_allocated_capacity = *psVar6;
          local_e8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_e8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_e8);
        psVar6 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_108.field_2._M_allocated_capacity = *psVar6;
          local_108.field_2._8_8_ = plVar5[3];
          local_108._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_108.field_2._M_allocated_capacity = *psVar6;
          local_108._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_108._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        tcu::ResultCollector::fail(result,&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != paVar1) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if (local_c8.m_log != &local_b8) {
          operator_delete(local_c8.m_log,(ulong)((long)&(local_b8.m_log)->flags + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if (local_88 != local_78) {
          operator_delete(local_88,local_78[0] + 1);
        }
      }
      StateQueryUtil::verifyStateTextureParamFloatVec4
                (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 &local_50,(this->super_TextureTest).m_type);
      glu::CallLogWrapper::glTexParameteriv
                (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 local_40.m_data);
      GVar4 = glu::CallLogWrapper::glGetError(gl);
      if (GVar4 == 0) goto LAB_007f1241;
      local_88 = local_78;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Got Error ","");
      local_68.m_log = (TestLog *)glu::getErrorName;
      local_60 = GVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_a8,&local_68);
      uVar7 = 0xf;
      if (local_88 != local_78) {
        uVar7 = local_78[0];
      }
      if (uVar7 < local_a8._M_string_length + local_80) {
        uVar8 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          uVar8 = local_a8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar8 < local_a8._M_string_length + local_80) goto LAB_007f10a1;
        plVar5 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_a8,0,(char *)0x0,(ulong)local_88);
      }
      else {
LAB_007f10a1:
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_88,(ulong)local_a8._M_dataplus._M_p);
      }
      local_c8.m_log = &local_b8;
      pTVar3 = (TestLog *)(plVar5 + 2);
      if ((TestLog *)*plVar5 == pTVar3) {
        local_b8.m_log = pTVar3->m_log;
        lStack_b0 = plVar5[3];
      }
      else {
        local_b8.m_log = pTVar3->m_log;
        local_c8.m_log = (TestLog *)*plVar5;
      }
      local_c0 = plVar5[1];
      *plVar5 = (long)pTVar3;
      plVar5[1] = 0;
      *(undefined1 *)&pTVar3->m_log = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_e8.field_2._M_allocated_capacity = *psVar6;
        local_e8.field_2._8_8_ = plVar5[3];
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar6;
        local_e8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_e8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_e8);
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_108.field_2._M_allocated_capacity = *psVar6;
        local_108.field_2._8_8_ = plVar5[3];
        local_108._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar6;
        local_108._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_108._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      tcu::ResultCollector::fail(result,&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != paVar1) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if (local_c8.m_log != &local_b8) {
        operator_delete(local_c8.m_log,(ulong)((long)&(local_b8.m_log)->flags + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (local_88 != local_78) {
        operator_delete(local_88,local_78[0] + 1);
      }
LAB_007f1241:
      StateQueryUtil::verifyStateTextureParamNormalizedI32Vec4
                (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 &local_40,(this->super_TextureTest).m_type);
      tcu::TestLog::endSection(local_58.m_log);
      return;
    }
    pTVar3 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Set","");
    paVar1 = &local_e8.field_2;
    local_e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Set","");
    tcu::ScopedLogSection::ScopedLogSection(&local_68,pTVar3,&local_108,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    local_50.m_data[0] = NAN;
    local_50.m_data[1] = -NAN;
    local_50.m_data[2] = 4.2039e-45;
    local_50.m_data[3] = -NAN;
    glu::CallLogWrapper::glTexParameterIiv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               (GLint *)&local_50);
    GVar4 = glu::CallLogWrapper::glGetError(gl);
    if (GVar4 == 0) goto LAB_007f0c44;
    local_88 = local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Got Error ","");
    local_40.m_data._0_8_ = glu::getErrorName;
    local_40.m_data[2] = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_a8,&local_40);
    uVar7 = 0xf;
    if (local_88 != local_78) {
      uVar7 = local_78[0];
    }
    if (uVar7 < local_a8._M_string_length + local_80) {
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        uVar8 = local_a8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_a8._M_string_length + local_80) goto LAB_007f07ae;
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_88)
      ;
    }
    else {
LAB_007f07ae:
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_88,(ulong)local_a8._M_dataplus._M_p);
    }
    local_c8.m_log = &local_b8;
    pTVar3 = (TestLog *)(plVar5 + 2);
    if ((TestLog *)*plVar5 == pTVar3) {
      local_b8.m_log = pTVar3->m_log;
      lStack_b0 = plVar5[3];
    }
    else {
      local_b8.m_log = pTVar3->m_log;
      local_c8.m_log = (TestLog *)*plVar5;
    }
    local_c0 = plVar5[1];
    *plVar5 = (long)pTVar3;
    plVar5[1] = 0;
    *(undefined1 *)&pTVar3->m_log = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_e8.field_2._M_allocated_capacity = *psVar6;
      local_e8.field_2._8_8_ = plVar5[3];
      local_e8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_e8.field_2._M_allocated_capacity = *psVar6;
      local_e8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_e8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_108.field_2._M_allocated_capacity = *psVar6;
      local_108.field_2._8_8_ = plVar5[3];
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar6;
      local_108._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_108._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::ResultCollector::fail(result,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8.m_log != &local_b8) {
      operator_delete(local_c8.m_log,(ulong)((long)&(local_b8.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_88 != local_78) {
      operator_delete(local_88,local_78[0] + 1);
    }
LAB_007f0c44:
    StateQueryUtil::verifyStateTextureParamIntegerVec4
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               (IVec4 *)&local_50,(this->super_TextureTest).m_type);
    tcu::TestLog::endSection(local_68.m_log);
    return;
  }
  pTVar3 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Set","");
  paVar1 = &local_e8.field_2;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Set","");
  tcu::ScopedLogSection::ScopedLogSection(&local_68,pTVar3,&local_108,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_50.m_data[0] = 3.85186e-34;
  local_50.m_data[1] = 2.8026e-45;
  local_50.m_data[2] = 4.2039e-45;
  local_50.m_data[3] = 1.79366e-43;
  glu::CallLogWrapper::glTexParameterIuiv
            (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
             (GLuint *)&local_50);
  GVar4 = glu::CallLogWrapper::glGetError(gl);
  if (GVar4 == 0) goto LAB_007f0e04;
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Got Error ","");
  local_40.m_data._0_8_ = glu::getErrorName;
  local_40.m_data[2] = GVar4;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_a8,&local_40);
  uVar7 = 0xf;
  if (local_88 != local_78) {
    uVar7 = local_78[0];
  }
  if (uVar7 < local_a8._M_string_length + local_80) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      uVar8 = local_a8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_a8._M_string_length + local_80) goto LAB_007f0920;
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_88);
  }
  else {
LAB_007f0920:
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_88,(ulong)local_a8._M_dataplus._M_p);
  }
  local_c8.m_log = &local_b8;
  pTVar3 = (TestLog *)(plVar5 + 2);
  if ((TestLog *)*plVar5 == pTVar3) {
    local_b8.m_log = pTVar3->m_log;
    lStack_b0 = plVar5[3];
  }
  else {
    local_b8.m_log = pTVar3->m_log;
    local_c8.m_log = (TestLog *)*plVar5;
  }
  local_c0 = plVar5[1];
  *plVar5 = (long)pTVar3;
  plVar5[1] = 0;
  *(undefined1 *)&pTVar3->m_log = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_e8.field_2._M_allocated_capacity = *psVar6;
    local_e8.field_2._8_8_ = plVar5[3];
    local_e8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_e8.field_2._M_allocated_capacity = *psVar6;
    local_e8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_e8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_e8);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_108.field_2._M_allocated_capacity = *psVar6;
    local_108.field_2._8_8_ = plVar5[3];
  }
  else {
    local_108.field_2._M_allocated_capacity = *psVar6;
    local_108._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_108._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  tcu::ResultCollector::fail(result,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (local_c8.m_log != &local_b8) {
    operator_delete(local_c8.m_log,(ulong)((long)&(local_b8.m_log)->flags + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
LAB_007f0e04:
  StateQueryUtil::verifyStateTextureParamUnsignedIntegerVec4
            (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
             (UVec4 *)&local_50,(this->super_TextureTest).m_type);
  tcu::TestLog::endSection(local_68.m_log);
  return;
}

Assistant:

void TextureBorderColorCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	// border color is undefined if queried with pure type and was not set to pure value
	if (m_type == QUERY_TEXTURE_PARAM_INTEGER_VEC4 || m_type == QUERY_TEXTURE_PARAM_FLOAT_VEC4)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateTextureParamFloatVec4(result, gl, m_target, m_pname, tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), m_type);
	}

	if (m_type == QUERY_TEXTURE_PARAM_PURE_INTEGER_VEC4)
	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Set", "Set");
		const tcu::IVec4			color			(0x7FFFFFFF, -2, 3, -128);

		gl.glTexParameterIiv(m_target, m_pname, color.getPtr());
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIiv");

		verifyStateTextureParamIntegerVec4(result, gl, m_target, m_pname, color, m_type);
	}
	else if (m_type == QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER_VEC4)
	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Set", "Set");
		const tcu::UVec4			color			(0x8000000ul, 2, 3, 128);

		gl.glTexParameterIuiv(m_target, m_pname, color.getPtr());
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIuiv");

		verifyStateTextureParamUnsignedIntegerVec4(result, gl, m_target, m_pname, color, m_type);
	}
	else
	{
		DE_ASSERT(m_type == QUERY_TEXTURE_PARAM_INTEGER_VEC4 || m_type == QUERY_TEXTURE_PARAM_FLOAT_VEC4);

		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Set", "Set");
		const tcu::Vec4				color			(0.25f, 1.0f, 0.0f, 0.77f);
		const tcu::IVec4			icolor			(0x8000000ul, 0x7FFFFFFF, 0, 0x0FFFFFFF);

		gl.glTexParameterfv(m_target, m_pname, color.getPtr());
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterfv");

		verifyStateTextureParamFloatVec4(result, gl, m_target, m_pname, color, m_type);

		gl.glTexParameteriv(m_target, m_pname, icolor.getPtr());
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameteriv");

		verifyStateTextureParamNormalizedI32Vec4(result, gl, m_target, m_pname, icolor, m_type);
	}
}